

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

ProtobufToFbsIdMap *
flatbuffers::anon_unknown_0::MapProtoIdsToFieldsId
          (ProtobufToFbsIdMap *__return_storage_ptr__,StructDef *struct_def,
          ProtoIdGapAction gap_action,bool no_log)

{
  Definition *pDVar1;
  FILE *__stream;
  bool bVar2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields_00;
  reference ppFVar3;
  Value *pVVar4;
  ulong uVar5;
  char *s;
  undefined8 uVar6;
  iterator iVar7;
  iterator iVar8;
  unsigned_short local_ea;
  reference local_e8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *element;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  voffset_t id;
  unsigned_short local_a6 [4];
  voffset_t proto_id;
  allocator<char> local_91;
  string local_90;
  Value *local_70;
  Value *id_attribute;
  FieldDef *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  proto_ids;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  bool no_log_local;
  ProtoIdGapAction gap_action_local;
  StructDef *struct_def_local;
  ProtobufToFbsIdMap *proto_to_fbs;
  
  fields_00 = &(struct_def->fields).vec;
  bVar2 = HasFieldWithId(fields_00);
  if (bVar2) {
    bVar2 = ProtobufIdSanityCheck(struct_def,gap_action,no_log);
    if (bVar2) {
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__range2);
      __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                         (fields_00);
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (fields_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                         *)&field), bVar2) {
        ppFVar3 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&__end2);
        id_attribute = (Value *)*ppFVar3;
        pDVar1 = &((FieldDef *)id_attribute)->super_Definition;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"id",&local_91);
        pVVar4 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        __stream = _stderr;
        local_70 = pVVar4;
        if (pVVar4 == (Value *)0x0) {
          if (!no_log) {
            uVar6 = std::__cxx11::string::c_str();
            fprintf(__stream,"Fields id in struct %s is missing\n",uVar6);
          }
          memset(__return_storage_ptr__,0,0x38);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
          ::unordered_map(&__return_storage_ptr__->field_to_id);
          __return_storage_ptr__->successful = false;
          goto LAB_0034e781;
        }
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) == 0) || (*(int *)((long)&id_attribute[2].constant.field_2 + 8) != 0x10)) {
          local_a6[0] = 0;
          s = (char *)std::__cxx11::string::c_str();
          StringToNumber<unsigned_short>(s,local_a6);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<unsigned_short&,std::__cxx11::string_const&>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&__range2,local_a6,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     id_attribute);
        }
        else {
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<int_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&__range2,&MapProtoIdsToFieldsId::UNION_ID,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     id_attribute);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&__end2);
      }
      iVar7 = std::
              begin<std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>
                        ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2);
      iVar8 = std::
              end<std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>
                        ((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,flatbuffers::(anonymous_namespace)::MapProtoIdsToFieldsId(flatbuffers::StructDef_const&,flatbuffers::IDLOptions::ProtoIdGapAction,bool)::__0>
                (iVar7._M_current,iVar8._M_current);
      ProtobufToFbsIdMap::ProtobufToFbsIdMap(__return_storage_ptr__);
      __range2_1._4_2_ = 0;
      __end2_1 = std::
                 vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2);
      element = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&element), bVar2) {
        local_e8 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator*(&__end2_1);
        if (local_e8->first == -1) {
          __range2_1._4_2_ = __range2_1._4_2_ + 1;
        }
        local_ea = __range2_1._4_2_;
        std::
        unordered_map<std::__cxx11::string,unsigned_short,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>>
        ::emplace<std::__cxx11::string_const&,unsigned_short>
                  ((unordered_map<std::__cxx11::string,unsigned_short,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_short>>>
                    *)__return_storage_ptr__,&local_e8->second,&local_ea);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end2_1);
        __range2_1._4_2_ = __range2_1._4_2_ + 1;
      }
      __return_storage_ptr__->successful = true;
LAB_0034e781:
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range2);
    }
    else {
      memset(__return_storage_ptr__,0,0x38);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
      ::unordered_map(&__return_storage_ptr__->field_to_id);
      __return_storage_ptr__->successful = false;
    }
  }
  else {
    proto_ids.
    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    ProtobufToFbsIdMap::ProtobufToFbsIdMap(__return_storage_ptr__);
    __return_storage_ptr__->successful = true;
  }
  return __return_storage_ptr__;
}

Assistant:

static ProtobufToFbsIdMap MapProtoIdsToFieldsId(
    const StructDef &struct_def, IDLOptions::ProtoIdGapAction gap_action,
    bool no_log) {
  const auto &fields = struct_def.fields.vec;

  if (!HasFieldWithId(fields)) {
    ProtobufToFbsIdMap result;
    result.successful = true;
    return result;
  }

  if (!ProtobufIdSanityCheck(struct_def, gap_action, no_log)) { return {}; }

  static constexpr int UNION_ID = -1;
  using ProtoIdFieldNamePair = std::pair<int, std::string>;
  std::vector<ProtoIdFieldNamePair> proto_ids;

  for (const auto *field : fields) {
    const auto *id_attribute = field->attributes.Lookup("id");
    if (id_attribute != nullptr) {
      // When we have union but do not use union flag to keep them
      if (id_attribute->constant.empty() &&
          field->value.type.base_type == BASE_TYPE_UNION) {
        proto_ids.emplace_back(UNION_ID, field->name);
      } else {
        voffset_t proto_id = 0;
        StringToNumber(id_attribute->constant.c_str(), &proto_id);
        proto_ids.emplace_back(proto_id, field->name);
      }
    } else {
      // TODO: Use LogCompilerWarn
      if (!no_log) {
        fprintf(stderr, "Fields id in struct %s is missing\n",
                struct_def.name.c_str());
      }
      return {};
    }
  }

  std::sort(
      std::begin(proto_ids), std::end(proto_ids),
      [](const ProtoIdFieldNamePair &rhs, const ProtoIdFieldNamePair &lhs) {
        return rhs.first < lhs.first;
      });
  struct ProtobufToFbsIdMap proto_to_fbs;

  voffset_t id = 0;
  for (const auto &element : proto_ids) {
    if (element.first == UNION_ID) { id++; }
    proto_to_fbs.field_to_id.emplace(element.second, id++);
  }
  proto_to_fbs.successful = true;
  return proto_to_fbs;
}